

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

ch_string * ch_table_find_string(ch_table *table,char *value,size_t size)

{
  uint32_t uVar1;
  ch_table_entry *pcVar2;
  ch_string *pcVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  
  if (table->size == 0) {
    return (ch_string *)0x0;
  }
  uVar4 = ch_hash_string(value,size);
  uVar1 = table->capacity;
  pcVar2 = table->entries;
  uVar7 = uVar4;
  do {
    uVar6 = uVar7 & uVar1 - 1;
    pcVar3 = pcVar2[uVar6].key;
    if (pcVar3 == (ch_string *)0x0) {
      if (pcVar2[uVar6].value.type == PRIMITIVE_NULL) {
        return (ch_string *)0x0;
      }
    }
    else if (((pcVar3->size == size) &&
             (iVar5 = bcmp(pcVar3->value,value,size), pcVar3->hash == uVar4)) && (iVar5 == 0)) {
      return pcVar3;
    }
    uVar7 = uVar6 + 1;
  } while( true );
}

Assistant:

ch_string *ch_table_find_string(ch_table *table, const char *value,
                                size_t size) {
  if (table->size == 0)
    return NULL;

  uint32_t hash = ch_hash_string(value, size);
  uint32_t index = hash & (table->capacity - 1);
  for (;;) {
    ch_table_entry *entry = &table->entries[index];
    if (entry->key == NULL) {

      if (IS_NULL(entry->value))
        return NULL;
    } else  {
    // } else if (entry->key->size == size && entry->key->hash == hash &&
    //            memcmp(entry->key->value, value, size) == 0) {
      bool a = entry->key->size == size;
      bool b = entry->key->hash == hash;
      bool result = memcmp(entry->key->value, value, size) == 0;
      if (a && b && result) {
        return entry->key;
      }

    }

    index = (index + 1) & (table->capacity - 1);
  }
}